

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O2

void __thiscall re2c::Dot::emit(Dot *this,OutputFile *o)

{
  Case *pCVar1;
  pointer ppVar2;
  uint uVar3;
  OutputFile *pOVar4;
  ulong uVar5;
  uint32_t i;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = (ulong)this->cases->cases_size;
  if (uVar5 == 1) {
    pOVar4 = OutputFile::wlabel(o,(label_t)(this->from->label).value);
    pOVar4 = OutputFile::ws(pOVar4," -> ");
    pOVar4 = OutputFile::wlabel(pOVar4,(label_t)(this->cases->cases->to->label).value);
    OutputFile::ws(pOVar4,"\n");
    return;
  }
  for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    pOVar4 = OutputFile::wlabel(o,(label_t)(this->from->label).value);
    pOVar4 = OutputFile::ws(pOVar4," -> ");
    pOVar4 = OutputFile::wlabel(pOVar4,(label_t)((this->cases->cases[uVar6].to)->label).value);
    OutputFile::ws(pOVar4," [label=\"");
    uVar3 = 0;
    while( true ) {
      uVar7 = (ulong)uVar3;
      pCVar1 = this->cases->cases;
      ppVar2 = pCVar1[uVar6].ranges.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)pCVar1[uVar6].ranges.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3) <= uVar7)
      break;
      OutputFile::wrange(o,ppVar2[uVar7].first,ppVar2[uVar7].second);
      uVar3 = uVar3 + 1;
    }
    OutputFile::ws(o,"\"]\n");
  }
  return;
}

Assistant:

void Dot::emit (OutputFile & o)
{
	const uint32_t n = cases->cases_size;
	if (n == 1)
	{
		o.wlabel(from->label).ws(" -> ").wlabel(cases->cases[0].to->label).ws("\n");
	}
	else
	{
		for (uint32_t i = 0; i < n; ++i)
		{
			o.wlabel(from->label).ws(" -> ").wlabel(cases->cases[i].to->label).ws(" [label=\"");
			for (uint32_t j = 0; j < cases->cases[i].ranges.size (); ++j)
			{
				o.wrange(cases->cases[i].ranges[j].first, cases->cases[i].ranges[j].second);
			}
			o.ws("\"]\n");
		}
	}
}